

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void opj_pi_update_encoding_parameters(opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no)

{
  opj_tcp_t *poVar1;
  opj_tcp_t *l_tcp;
  OPJ_UINT32 local_48;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  OPJ_UINT32 p_tile_no_local;
  opj_cp_t *p_cp_local;
  opj_image_t *p_image_local;
  
  l_max_prec = p_tile_no;
  _l_max_res = p_cp;
  p_cp_local = (opj_cp_t *)p_image;
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x804,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  if (p_image != (opj_image_t *)0x0) {
    if (p_tile_no < p_cp->tw * p_cp->th) {
      poVar1 = p_cp->tcps;
      opj_get_encoding_parameters
                (p_image,p_cp,p_tile_no,&l_ty0,&l_ty1,(OPJ_INT32 *)&l_dx_min,(OPJ_INT32 *)&l_dy_min,
                 &local_48,(OPJ_UINT32 *)((long)&l_tcp + 4),(OPJ_UINT32 *)&l_tx1,
                 (OPJ_UINT32 *)&l_tx0);
      if (((byte)poVar1[p_tile_no].field_0x1638 >> 2 & 1) == 0) {
        opj_pi_update_encode_not_poc
                  (_l_max_res,p_cp_local->tdy,l_max_prec,l_ty0,l_ty1,l_dx_min,l_dy_min,l_tx1,l_tx0,
                   local_48,l_tcp._4_4_);
      }
      else {
        opj_pi_update_encode_poc_and_final
                  (_l_max_res,l_max_prec,l_ty0,l_ty1,l_dx_min,l_dy_min,l_tx1,l_tx0,local_48,
                   l_tcp._4_4_);
      }
      return;
    }
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x806,
                  "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
                 );
  }
  __assert_fail("p_image != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                ,0x805,
                "void opj_pi_update_encoding_parameters(const opj_image_t *, opj_cp_t *, OPJ_UINT32)"
               );
}

Assistant:

void opj_pi_update_encoding_parameters(const opj_image_t *p_image,
                                       opj_cp_t *p_cp,
                                       OPJ_UINT32 p_tile_no)
{
    /* encoding parameters to set */
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;

    /* pointers */
    opj_tcp_t *l_tcp = 00;

    /* preconditions */
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    l_tcp = &(p_cp->tcps[p_tile_no]);

    /* get encoding parameters */
    opj_get_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1, &l_ty0,
                                &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res);

    if (l_tcp->POC) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, p_image->numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }
}